

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferMAXSizeValidation.cpp
# Opt level: O1

void __thiscall
glcts::TextureBufferMAXSizeValidation::initTest(TextureBufferMAXSizeValidation *this)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  GLuint GVar4;
  undefined4 extraout_var;
  long lVar6;
  ulong uVar7;
  NotSupportedError *this_00;
  TestError *this_01;
  string csSource;
  char *csCode;
  long *local_50 [2];
  long local_40 [2];
  long *local_30;
  long lVar5;
  
  if ((this->super_TestCaseBase).m_is_texture_buffer_supported == false) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Texture buffer functionality not supported, skipping",
               fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferMAXSizeValidation.cpp"
               ,0x46);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar2);
  (**(code **)(lVar5 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_TEXTURE_BUFFER_SIZE,
             &this->m_max_tex_buffer_size);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"Error getting gl parameter value!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferMAXSizeValidation.cpp"
                  ,0x4e);
  (**(code **)(lVar5 + 0x6c8))(1,&this->m_tbo_id);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"Error generating buffer object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferMAXSizeValidation.cpp"
                  ,0x52);
  (**(code **)(lVar5 + 0x40))
            ((this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,this->m_tbo_id);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"Error binding buffer object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferMAXSizeValidation.cpp"
                  ,0x54);
  (**(code **)(lVar5 + 0x150))
            ((this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,
             (long)this->m_max_tex_buffer_size,0,0x88e8);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"Error allocating buffer object\'s data store!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferMAXSizeValidation.cpp"
                  ,0x56);
  lVar6 = (**(code **)(lVar5 + 0xd00))
                    ((this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,0,
                     (long)this->m_max_tex_buffer_size,2);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"Error mapping buffer object\'s data store to client\'s address space!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferMAXSizeValidation.cpp"
                  ,0x5c);
  if (this->m_max_tex_buffer_size != 0) {
    uVar7 = 0;
    do {
      *(char *)(lVar6 + uVar7) = (char)uVar7;
      uVar7 = uVar7 + 1;
    } while (uVar7 < (uint)this->m_max_tex_buffer_size);
  }
  (**(code **)(lVar5 + 0x1670))((this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"Error ummapping buffer object\'s data store from client\'s address space!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferMAXSizeValidation.cpp"
                  ,100);
  (**(code **)(lVar5 + 0x6f8))(1,&this->m_tbo_tex_id);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"Error generating texture object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferMAXSizeValidation.cpp"
                  ,0x68);
  (**(code **)(lVar5 + 8))(0x84c0);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"Error asetting active texture unit!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferMAXSizeValidation.cpp"
                  ,0x6a);
  (**(code **)(lVar5 + 0xb8))
            ((this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,this->m_tbo_tex_id);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"Error binding texture object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferMAXSizeValidation.cpp"
                  ,0x6c);
  (**(code **)(lVar5 + 0x12f8))
            ((this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,0x8232,this->m_tbo_id);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"Error binding buffer object as data store for texture buffer!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferMAXSizeValidation.cpp"
                  ,0x6f);
  GVar4 = (**(code **)(lVar5 + 0x3c8))();
  this->m_po_id = GVar4;
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"Error creating program object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferMAXSizeValidation.cpp"
                  ,0x73);
  GVar4 = (**(code **)(lVar5 + 0x3f0))(0x91b9);
  this->m_cs_id = GVar4;
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"Error creating shader object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferMAXSizeValidation.cpp"
                  ,0x76);
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,
             "${VERSION}\n\n${TEXTURE_BUFFER_REQUIRE}\n\nprecision highp float;\n\nuniform highp usamplerBuffer sampler_buffer;\n\nbuffer ComputeSSBO\n{\n    uvec3 outValue;\n} computeSSBO;\n\nlayout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n\nvoid main(void)\n{\n    computeSSBO.outValue.x = uint( textureSize(sampler_buffer) );\n    computeSSBO.outValue.y = uint( texelFetch (sampler_buffer, 0).x );\n    computeSSBO.outValue.z = uint( texelFetch (sampler_buffer, int(computeSSBO.outValue.x) - 1 ).x );\n}\n"
             ,"");
  local_30 = local_50[0];
  bVar1 = TestCaseBase::buildProgram
                    (&this->super_TestCaseBase,this->m_po_id,this->m_cs_id,1,(char **)&local_30,
                     (bool *)0x0);
  if (bVar1) {
    (**(code **)(lVar5 + 0x6c8))(1,&this->m_ssbo_id);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"Error generating buffer object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferMAXSizeValidation.cpp"
                    ,0x82);
    (**(code **)(lVar5 + 0x40))(0x8892,this->m_ssbo_id);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"Error binding  buffer object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferMAXSizeValidation.cpp"
                    ,0x84);
    (**(code **)(lVar5 + 0x150))(0x8892,0xc,0,0x88ea);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"Error generating buffer object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferMAXSizeValidation.cpp"
                    ,0x86);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    return;
  }
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_01,"Could not create program from valid compute shader object!",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferMAXSizeValidation.cpp"
             ,0x7d);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void TextureBufferMAXSizeValidation::initTest(void)
{
	/* Check if texture buffer extension is supported */
	if (!m_is_texture_buffer_supported)
	{
		throw tcu::NotSupportedError(TEXTURE_BUFFER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* Get GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Query for the value of max texture buffer size */
	gl.getIntegerv(m_glExtTokens.MAX_TEXTURE_BUFFER_SIZE, &m_max_tex_buffer_size);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error getting gl parameter value!");

	/* Create texture buffer object*/
	gl.genBuffers(1, &m_tbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error generating buffer object!");
	gl.bindBuffer(m_glExtTokens.TEXTURE_BUFFER, m_tbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding buffer object!");
	gl.bufferData(m_glExtTokens.TEXTURE_BUFFER, m_max_tex_buffer_size * sizeof(glw::GLubyte), DE_NULL, GL_DYNAMIC_DRAW);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error allocating buffer object's data store!");

	glw::GLubyte* buf = 0;

	buf = (glw::GLubyte*)gl.mapBufferRange(m_glExtTokens.TEXTURE_BUFFER, 0,
										   m_max_tex_buffer_size * sizeof(glw::GLubyte), GL_MAP_WRITE_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error mapping buffer object's data store to client's address space!");

	for (glw::GLuint i = 0; i < (glw::GLuint)m_max_tex_buffer_size; ++i)
	{
		buf[i] = (glw::GLubyte)(i % 256);
	}

	gl.unmapBuffer(m_glExtTokens.TEXTURE_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error ummapping buffer object's data store from client's address space!");

	/* Initialize texture buffer */
	gl.genTextures(1, &m_tbo_tex_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error generating texture object!");
	gl.activeTexture(GL_TEXTURE0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error asetting active texture unit!");
	gl.bindTexture(m_glExtTokens.TEXTURE_BUFFER, m_tbo_tex_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding texture object!");

	gl.texBuffer(m_glExtTokens.TEXTURE_BUFFER, GL_R8UI, m_tbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding buffer object as data store for texture buffer!");

	/* Create program object */
	m_po_id = gl.createProgram();
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error creating program object!");

	m_cs_id = gl.createShader(GL_COMPUTE_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error creating shader object!");

	std::string csSource = getComputeShaderCode();
	const char* csCode   = csSource.c_str();

	if (!buildProgram(m_po_id, m_cs_id, 1, &csCode))
	{
		TCU_FAIL("Could not create program from valid compute shader object!");
	}

	/* Create Shader Storage Buffer Object */
	gl.genBuffers(1, &m_ssbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error generating buffer object!");
	gl.bindBuffer(GL_ARRAY_BUFFER, m_ssbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding  buffer object!");
	gl.bufferData(GL_ARRAY_BUFFER, m_n_vec_components * sizeof(glw::GLuint), 0, GL_DYNAMIC_COPY);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error generating buffer object!");
}